

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.h
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::Private_Impl_Still(Private_Impl_Still *this)

{
  Private_Impl_Still *in_RDI;
  
  in_RDI->API_NAME = "Private_Impl_Still";
  setDefaults(in_RDI);
  in_RDI->camera = (MMAL_COMPONENT_T *)0x0;
  in_RDI->encoder = (MMAL_COMPONENT_T *)0x0;
  in_RDI->encoder_connection = (MMAL_CONNECTION_T *)0x0;
  in_RDI->encoder_pool = (MMAL_POOL_T *)0x0;
  in_RDI->camera_still_port = (MMAL_PORT_T *)0x0;
  in_RDI->encoder_input_port = (MMAL_PORT_T *)0x0;
  in_RDI->encoder_output_port = (MMAL_PORT_T *)0x0;
  in_RDI->_isInitialized = false;
  return;
}

Assistant:

Private_Impl_Still() {
                API_NAME = "Private_Impl_Still";
                setDefaults();
                camera = NULL;
                encoder = NULL;
                encoder_connection = NULL;
                encoder_pool = NULL;
                camera_still_port = NULL;
                encoder_input_port = NULL;
                encoder_output_port = NULL;
		_isInitialized=false;
            }